

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O1

RK_S32 parse_ptl(HEVCContext *s,PTL *ptl,int max_num_sub_layers)

{
  BitReadCtx_t *bitctx;
  int iVar1;
  MPP_RET MVar2;
  PTLCommon *ptl_00;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  RK_U8 *pRVar6;
  RK_S32 _out;
  byte local_40 [4];
  uint local_3c;
  ulong local_38;
  
  bitctx = &s->HEVClc->gb;
  decode_profile_tier_level(s,&ptl->general_ptl);
  MVar2 = mpp_read_bits(bitctx,8,(RK_S32 *)local_40);
  bitctx->ret = MVar2;
  if (MVar2 == MPP_OK) {
    (ptl->general_ptl).level_idc = local_40[0];
    local_3c = max_num_sub_layers - 1;
    local_38 = (ulong)(uint)max_num_sub_layers;
    if (1 < max_num_sub_layers) {
      uVar4 = (ulong)local_3c;
      uVar5 = 0;
      do {
        MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)local_40);
        bitctx->ret = MVar2;
        if (MVar2 != MPP_OK) {
          return MVar2;
        }
        ptl->sub_layer_profile_present_flag[uVar5] = local_40[0];
        MVar2 = mpp_read_bits(bitctx,1,(RK_S32 *)local_40);
        bitctx->ret = MVar2;
        if (MVar2 != MPP_OK) {
          return MVar2;
        }
        ptl->sub_layer_level_present_flag[uVar5] = local_40[0];
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    iVar1 = (int)local_38;
    MVar2 = iVar1 + MPP_ERR_UNKNOW;
    if ((uint)MVar2 < 7) {
      iVar3 = iVar1 + -9;
      do {
        MVar2 = mpp_skip_longbits(bitctx,2);
        bitctx->ret = MVar2;
        if (MVar2 != MPP_OK) {
          return MVar2;
        }
        iVar3 = iVar3 + 1;
        MVar2 = MPP_OK;
      } while (iVar3 != 0);
    }
    if (1 < iVar1) {
      pRVar6 = ptl->sub_layer_profile_present_flag;
      ptl_00 = ptl->sub_layer_ptl;
      uVar4 = (ulong)local_3c;
      do {
        if (*pRVar6 != '\0') {
          MVar2 = decode_profile_tier_level(s,ptl_00);
        }
        if (pRVar6[7] != '\0') {
          MVar2 = mpp_read_bits(bitctx,8,(RK_S32 *)local_40);
          bitctx->ret = MVar2;
          if (MVar2 != MPP_OK) {
            return MVar2;
          }
          MVar2 = (MPP_RET)local_40[0];
          ptl_00->level_idc = local_40[0];
        }
        pRVar6 = pRVar6 + 1;
        ptl_00 = ptl_00 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  return MVar2;
}

Assistant:

static RK_S32 parse_ptl(HEVCContext *s, PTL *ptl, int max_num_sub_layers)
{
    RK_S32 i;
    HEVCLocalContext *lc = s->HEVClc;
    BitReadCtx_t *gb = &lc->gb;

    decode_profile_tier_level(s, &ptl->general_ptl);
    READ_BITS(gb, 8, &ptl->general_ptl.level_idc);

    for (i = 0; i < max_num_sub_layers - 1; i++) {
        READ_ONEBIT(gb, &ptl->sub_layer_profile_present_flag[i]);
        READ_ONEBIT(gb, &ptl->sub_layer_level_present_flag[i]);
    }
    if (max_num_sub_layers - 1 > 0)
        for (i = max_num_sub_layers - 1; i < 8; i++)
            SKIP_BITS(gb, 2); // reserved_zero_2bits[i]
    for (i = 0; i < max_num_sub_layers - 1; i++) {
        if (ptl->sub_layer_profile_present_flag[i])
            decode_profile_tier_level(s, &ptl->sub_layer_ptl[i]);
        if (ptl->sub_layer_level_present_flag[i])
            READ_BITS(gb, 8, &ptl->sub_layer_ptl[i].level_idc);
    }

    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}